

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plink.c
# Opt level: O3

void try_output(_Bool is_stderr)

{
  Backend *pBVar1;
  _Bool _Var2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  size_t __n;
  int iVar6;
  undefined7 in_register_00000039;
  bufchain *ch;
  ptrlen pVar7;
  
  iVar6 = (int)CONCAT71(in_register_00000039,is_stderr);
  ch = &stdout_data;
  if (iVar6 != 0) {
    ch = &stderr_data;
  }
  sVar3 = bufchain_size(ch);
  if (sVar3 != 0) {
    iVar6 = iVar6 + 1;
    _Var2 = nonblock(iVar6);
    do {
      pVar7 = bufchain_prefix(ch);
      __n = pVar7.len;
      sVar3 = write(iVar6,pVar7.ptr,__n);
      if (0 < (long)sVar3) {
        bufchain_consume(ch,sVar3);
      }
    } while ((sVar3 == __n) && (sVar4 = bufchain_size(ch), sVar3 = __n, sVar4 != 0));
    if (!_Var2) {
      no_nonblock(iVar6);
    }
    if (((long)sVar3 < 0) && (piVar5 = __errno_location(), *piVar5 != 0xb)) {
      try_output_cold_1();
      write(signalpipe[1],"x",1);
      return;
    }
    pBVar1 = backend;
    sVar3 = bufchain_size(&stdout_data);
    sVar4 = bufchain_size(&stderr_data);
    (*pBVar1->vt->unthrottle)(pBVar1,sVar3 + sVar4);
  }
  if ((outgoingeof == ADDRTYPE_IPV4) && (sVar3 = bufchain_size(&stdout_data), sVar3 == 0)) {
    close(1);
    outgoingeof = ADDRTYPE_IPV6;
  }
  return;
}

Assistant:

void try_output(bool is_stderr)
{
    bufchain *chain = (is_stderr ? &stderr_data : &stdout_data);
    int fd = (is_stderr ? STDERR_FILENO : STDOUT_FILENO);
    ssize_t ret;

    if (bufchain_size(chain) > 0) {
        bool prev_nonblock = nonblock(fd);
        ptrlen senddata;
        do {
            senddata = bufchain_prefix(chain);
            ret = write(fd, senddata.ptr, senddata.len);
            if (ret > 0)
                bufchain_consume(chain, ret);
        } while (ret == senddata.len && bufchain_size(chain) != 0);
        if (!prev_nonblock)
            no_nonblock(fd);
        if (ret < 0 && errno != EAGAIN) {
            perror(is_stderr ? "stderr: write" : "stdout: write");
            exit(1);
        }

        backend_unthrottle(backend, output_backlog());
    }
    if (outgoingeof == EOF_PENDING && bufchain_size(&stdout_data) == 0) {
        close(STDOUT_FILENO);
        outgoingeof = EOF_SENT;
    }
}